

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall CommandDrawInventoryBar::~CommandDrawInventoryBar(CommandDrawInventoryBar *this)

{
  CommandDrawNumber **ppCVar1;
  uint i;
  ulong uVar2;
  
  (this->super_SBarInfoCommand)._vptr_SBarInfoCommand =
       (_func_int **)&PTR__CommandDrawInventoryBar_007e5120;
  if (this->counters != (CommandDrawNumber **)0x0) {
    for (uVar2 = 0; ppCVar1 = this->counters, uVar2 < this->size; uVar2 = uVar2 + 1) {
      if (ppCVar1[uVar2] != (CommandDrawNumber *)0x0) {
        (*(ppCVar1[uVar2]->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand[1])
                  ();
      }
    }
    if (ppCVar1 != (CommandDrawNumber **)0x0) {
      operator_delete__(ppCVar1);
      return;
    }
  }
  return;
}

Assistant:

~CommandDrawInventoryBar()
		{
			if(counters != NULL)
			{
				for(unsigned int i = 0;i < size;i++)
					delete counters[i];
				delete[] counters;
			}
		}